

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O2

void crnlib::Bt3Zip_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  uint lenLimit;
  UInt32 pos;
  Byte *cur;
  ushort uVar1;
  UInt32 UVar2;
  
  do {
    lenLimit = p->lenLimit;
    if (lenLimit < 3) {
      MatchFinder_MovePos(p);
    }
    else {
      cur = p->buffer;
      uVar1 = (ushort)p->crc[cur[1]] ^ CONCAT11(*cur,cur[2]);
      UVar2 = p->hash[uVar1];
      pos = p->pos;
      p->hash[uVar1] = pos;
      SkipMatchesSpec(lenLimit,UVar2,pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                      p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar2 = p->pos + 1;
      p->pos = UVar2;
      if (UVar2 == p->posLimit) {
        MatchFinder_CheckLimits(p);
      }
    }
    num = num - 1;
  } while (num != 0);
  return;
}

Assistant:

void Bt3Zip_MatchFinder_Skip(CMatchFinder* p, UInt32 num) {
  do {
    SKIP_HEADER(3)
    HASH_ZIP_CALC;
    curMatch = p->hash[hashValue];
    p->hash[hashValue] = p->pos;
    SKIP_FOOTER
  } while (--num != 0);
}